

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_postprocess.cpp
# Opt level: O2

void __thiscall FGLRenderer::ClearBorders(FGLRenderer *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = SDLGLFB::GetClientWidth(&this->framebuffer->super_SDLGLFB);
  iVar2 = SDLGLFB::GetClientHeight(&this->framebuffer->super_SDLGLFB);
  if (iVar2 == 0 || iVar1 == 0) {
    return;
  }
  (*_ptrc_glViewport)(0,0,iVar1,iVar2);
  (*_ptrc_glClearColor)(0.0,0.0,0.0,1.0);
  (*_ptrc_glEnable)(0xc11);
  iVar3 = (this->mOutputLetterbox).top;
  if (0 < iVar3) {
    (*_ptrc_glScissor)(0,0,iVar1,iVar3);
    (*_ptrc_glClear)(0x4000);
    iVar3 = (this->mOutputLetterbox).top;
  }
  iVar3 = iVar3 + (this->mOutputLetterbox).height;
  iVar2 = iVar2 - iVar3;
  if (0 < iVar2) {
    (*_ptrc_glScissor)(0,iVar3,iVar1,iVar2);
    (*_ptrc_glClear)(0x4000);
  }
  iVar2 = (this->mOutputLetterbox).left;
  if (0 < iVar2) {
    (*_ptrc_glScissor)(0,(this->mOutputLetterbox).top,iVar2,(this->mOutputLetterbox).height);
    (*_ptrc_glClear)(0x4000);
    iVar2 = (this->mOutputLetterbox).left;
  }
  iVar2 = iVar2 + (this->mOutputLetterbox).width;
  iVar1 = iVar1 - iVar2;
  if (0 < iVar1) {
    (*_ptrc_glScissor)(iVar2,(this->mOutputLetterbox).top,iVar1,(this->mOutputLetterbox).height);
    (*_ptrc_glClear)(0x4000);
  }
  (*_ptrc_glDisable)(0xc11);
  return;
}

Assistant:

void FGLRenderer::ClearBorders()
{
	const auto &box = mOutputLetterbox;

	int clientWidth = framebuffer->GetClientWidth();
	int clientHeight = framebuffer->GetClientHeight();
	if (clientWidth == 0 || clientHeight == 0)
		return;

	glViewport(0, 0, clientWidth, clientHeight);
	glClearColor(0.0f, 0.0f, 0.0f, 1.0f);
	glEnable(GL_SCISSOR_TEST);
	if (box.top > 0)
	{
		glScissor(0, 0, clientWidth, box.top);
		glClear(GL_COLOR_BUFFER_BIT);
	}
	if (clientHeight - box.top - box.height > 0)
	{
		glScissor(0, box.top + box.height, clientWidth, clientHeight - box.top - box.height);
		glClear(GL_COLOR_BUFFER_BIT);
	}
	if (box.left > 0)
	{
		glScissor(0, box.top, box.left, box.height);
		glClear(GL_COLOR_BUFFER_BIT);
	}
	if (clientWidth - box.left - box.width > 0)
	{
		glScissor(box.left + box.width, box.top, clientWidth - box.left - box.width, box.height);
		glClear(GL_COLOR_BUFFER_BIT);
	}
	glDisable(GL_SCISSOR_TEST);
}